

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O1

void __thiscall HEkkDual::shiftBack(HEkkDual *this,HighsInt iCol)

{
  HighsInt *pHVar1;
  double dVar2;
  pointer pdVar3;
  pointer pdVar4;
  
  pdVar3 = (this->ekk_instance_->info_).workShift_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  dVar2 = pdVar3[iCol];
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    pdVar4 = (this->ekk_instance_->info_).workDual_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar4[iCol] = pdVar4[iCol] - dVar2;
    pdVar3[iCol] = 0.0;
    pHVar1 = &this->analysis->net_num_single_cost_shift;
    *pHVar1 = *pHVar1 + -1;
  }
  return;
}

Assistant:

void HEkkDual::shiftBack(const HighsInt iCol) {
  HighsSimplexInfo& info = ekk_instance_.info_;
  if (!info.workShift_[iCol]) return;
  info.workDual_[iCol] -= info.workShift_[iCol];
  info.workShift_[iCol] = 0;
  // Analysis
  analysis->net_num_single_cost_shift--;
}